

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlq.cpp
# Opt level: O3

bool __thiscall
pg::TLQSolver::attractTangle(TLQSolver *this,int t,int pl,bitset *R,bitset *Z,bitset *G)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  uint *puVar4;
  ostream *poVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  uint *puVar9;
  ulong uVar10;
  _label_vertex local_40;
  
  piVar3 = (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  uVar7 = piVar3[t];
  if ((uVar7 & 1) == pl && uVar7 != 0xffffffff) {
    puVar4 = (uint *)(this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                     super__Vector_impl_data._M_start[t];
    uVar7 = *puVar4;
    if (uVar7 != 0xffffffff) {
      bVar8 = false;
      puVar9 = puVar4;
      uVar1 = uVar7;
      do {
        while( true ) {
          puVar9 = puVar9 + 2;
          uVar6 = (ulong)(long)(int)uVar1 >> 6;
          if (((this->G)._bits[uVar6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
            piVar3[t] = -1;
            return false;
          }
          uVar10 = 1L << ((ulong)uVar1 & 0x3f);
          if ((Z->_bits[uVar6] & uVar10) == 0) break;
          uVar1 = *puVar9;
          if (*puVar9 == 0xffffffff) {
            if (!bVar8) {
              return false;
            }
            goto LAB_00178a8e;
          }
        }
        if ((R->_bits[uVar6] & uVar10) == 0) {
          return false;
        }
        uVar1 = *puVar9;
        bVar8 = true;
      } while (uVar1 != 0xffffffff);
LAB_00178a8e:
      puVar9 = (uint *)(this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                       super__Vector_impl_data._M_start[t];
      uVar1 = *puVar9;
      if (uVar1 != 0xffffffff) {
        do {
          puVar9 = puVar9 + 1;
          if (((Z->_bits[(ulong)(long)(int)uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) &&
             ((G->_bits[(ulong)(long)(int)uVar1 >> 6] & 1L << ((ulong)uVar1 & 0x3f)) != 0)) {
            return false;
          }
          uVar1 = *puVar9;
        } while (uVar1 != 0xffffffff);
      }
      do {
        uVar10 = (ulong)(int)uVar7;
        uVar6 = Z->_bits[uVar10 >> 6];
        if ((uVar6 >> (uVar10 & 0x3f) & 1) == 0) {
          uVar1 = puVar4[1];
          Z->_bits[uVar10 >> 6] = uVar6 | 1L << (uVar10 & 0x3f);
          this->str[uVar10] = uVar1;
          iVar2 = (this->Q).pointer;
          (this->Q).pointer = iVar2 + 1;
          (this->Q).queue[iVar2] = uVar7;
          if (2 < (this->super_Solver).trace) {
            poVar5 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\x1b[1;37mattracted \x1b[36m",0x16);
            local_40.g = (this->super_Solver).game;
            local_40.v = uVar7;
            poVar5 = operator<<(poVar5,&local_40);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m by \x1b[1;36m",0xe);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,pl);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m",3);
            poVar5 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," (via tangle ",0xd);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,t);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
            std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
          }
        }
        uVar7 = puVar4[2];
        puVar4 = puVar4 + 2;
      } while (uVar7 != 0xffffffff);
      return true;
    }
  }
  return false;
}

Assistant:

bool
TLQSolver::attractTangle(int t, const int pl, bitset &R, bitset &Z, bitset &G)
{
    /**
     * Check if tangle is won by player <pl> and not deleted
     */
    {
        const int tangle_pr = tpr[t];
        if (tangle_pr == -1) return false; // deleted tangle
        if (pl != (tangle_pr&1)) return false; // not of desired parity
    }

    /**
     * Check if tangle is contained in Z+R and if any vertices are not already in Z
     * We require at least one vertex in Z\R. Otherwise, don´t attract.
     */
    {
        bool can_attract_new = false;
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            ptr++; // skip strategy
            if (!this->G[v]) {
                // on-the-fly detect out-of-game tangles
                tpr[t] = -1; // delete the tangle
                return false; // is now a deleted tangle
            } else if (Z[v]) {
                continue; // already attracted
            } else if (!R[v]) {
                return false; // not contained in Z+R
            } else {
                can_attract_new = true; // has vertices not yet attracted
            }
        }
        if (!can_attract_new) return false; // either no vertices in R\Z or strategy leaves R+Z
    }

    /**
     * Check if the tangle can escape to G\Z.
     */
    {
        int *ptr = tout[t];
        int v;
        while ((v=*ptr++) != -1) {
            if (Z[v]) continue;
            if (G[v]) return false; // opponent escapes
        }
    }

    /**
     * Attract!
     */
    {
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            const int s = *ptr++;
            if (Z[v]) continue; // already in <Z>
            Z[v] = true;
            str[v] = s;
            Q.push(v);

#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(v) << "\033[m by \033[1;36m" << pl << "\033[m";
                logger << " (via tangle " << t << ")" << std::endl;
            }
#endif
        }
    }

    return true;
}